

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

uint64_t __thiscall nuraft::raft_server::get_current_leader_index(raft_server *this)

{
  unsigned_long uVar1;
  __int_type _Var2;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  element_type *peVar7;
  undefined8 *puVar8;
  unsigned_long *puVar9;
  long in_RDI;
  uint64_t durable_index;
  ptr<raft_params> params;
  uint64_t leader_index;
  memory_order __b_1;
  memory_order __b;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  unsigned_long local_90;
  string local_88 [48];
  unsigned_long local_58 [3];
  __int_type local_40;
  unsigned_long local_30;
  memory_order local_28;
  int local_24;
  unsigned_long *local_20;
  undefined8 local_18;
  memory_order local_10;
  int local_c;
  undefined8 *local_8;
  
  local_40 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff28);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1a7a71);
  nuraft::context::get_params
            ((context *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  peVar5 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a7a8e);
  if ((peVar5->parallel_log_appending_ & 1U) != 0) {
    peVar6 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a7aa9);
    iVar4 = (*peVar6->_vptr_log_store[0x11])();
    local_58[0] = CONCAT44(extraout_var,iVar4);
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar3) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a7af7);
      iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
      if (5 < iVar4) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a7b27);
        uVar1 = local_58[0];
        puVar8 = (undefined8 *)(in_RDI + 0x90);
        local_c = 5;
        local_8 = puVar8;
        local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_c - 1U < 2) {
          local_18 = *puVar8;
        }
        else if (local_c == 5) {
          local_18 = *puVar8;
        }
        else {
          local_18 = *puVar8;
        }
        msg_if_given_abi_cxx11_
                  ((char *)local_88,"last durable index %lu, precommit index %lu",uVar1,local_18);
        (**(code **)(*(long *)peVar7 + 0x40))
                  (peVar7,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"get_current_leader_index",0x477,local_88);
        std::__cxx11::string::~string(local_88);
      }
    }
    puVar9 = (unsigned_long *)(in_RDI + 0x90);
    local_24 = 5;
    local_20 = puVar9;
    local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_24 - 1U < 2) {
      local_30 = *puVar9;
    }
    else if (local_24 == 5) {
      local_30 = *puVar9;
    }
    else {
      local_30 = *puVar9;
    }
    local_90 = local_30;
    puVar9 = std::min<unsigned_long>(&local_90,local_58);
    local_40 = *puVar9;
  }
  _Var2 = local_40;
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1a7d50);
  return _Var2;
}

Assistant:

uint64_t raft_server::get_current_leader_index() {
    uint64_t leader_index = precommit_index_;
    ptr<raft_params> params = ctx_->get_params();
    if (params->parallel_log_appending_) {
        // For parallel appending, take the smaller one.
        uint64_t durable_index = log_store_->last_durable_index();
        p_tr("last durable index %" PRIu64 ", precommit index %" PRIu64,
             durable_index, precommit_index_.load());
        leader_index = std::min(precommit_index_.load(), durable_index);
    }
    return leader_index;
}